

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

jp2_box_t * jp2_box_create(int type)

{
  jp2_boxinfo_t *pjVar1;
  jp2_boxinfo_t *boxinfo;
  jp2_box_t *box;
  jp2_box_t *pjStack_10;
  int type_local;
  
  pjStack_10 = jp2_box_create0();
  if (pjStack_10 == (jp2_box_t *)0x0) {
    pjStack_10 = (jp2_box_t *)0x0;
  }
  else {
    pjStack_10->type = (long)type;
    pjStack_10->len = 0;
    pjVar1 = jp2_boxinfolookup(type);
    if (pjVar1 == (jp2_boxinfo_t *)0x0) {
      pjStack_10 = (jp2_box_t *)0x0;
    }
    else {
      pjStack_10->info = pjVar1;
      pjStack_10->ops = &pjVar1->ops;
    }
  }
  return pjStack_10;
}

Assistant:

jp2_box_t *jp2_box_create(int type)
{
	jp2_box_t *box;
	const jp2_boxinfo_t *boxinfo;
	if (!(box = jp2_box_create0())) {
		return 0;
	}
	box->type = type;
	box->len = 0;
	if (!(boxinfo = jp2_boxinfolookup(type))) {
		return 0;
	}
	box->info = boxinfo;
	box->ops = &boxinfo->ops;
	return box;
}